

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createmidifile2.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t __n;
  void *__buf;
  int iVar1;
  int iVar2;
  long lVar3;
  MidiFile midifile;
  string local_c0;
  MidiFile local_a0;
  
  smf::MidiFile::MidiFile(&local_a0);
  smf::MidiFile::addTracks(&local_a0,2);
  smf::MidiFile::setTicksPerQuarterNote(&local_a0,0x78);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,"Twinkle, Twinkle Little Star","");
  smf::MidiFile::addTrackName(&local_a0,0,0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  smf::MidiFile::addTempo(&local_a0,0,0,104.0);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Melody","");
  smf::MidiFile::addTrackName(&local_a0,1,0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  iVar1 = 0;
  smf::MidiFile::addPatchChange(&local_a0,1,0,0,0x28);
  iVar2 = 0x48;
  lVar3 = 0;
  do {
    smf::MidiFile::addNoteOn(&local_a0,1,iVar1,0,iVar2,0x40);
    iVar1 = iVar1 + *(int *)((long)&DAT_0011b0e0 + lVar3) * 0x78;
    smf::MidiFile::addNoteOff(&local_a0,1,iVar1,0,iVar2,0x40);
    iVar2 = *(int *)((long)&DAT_0011b014 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x38);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Bass line","");
  smf::MidiFile::addTrackName(&local_a0,2,0,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  iVar1 = 0;
  smf::MidiFile::addPatchChange(&local_a0,2,0,1,0x3a);
  iVar2 = 0x30;
  lVar3 = 0;
  do {
    smf::MidiFile::addNoteOn(&local_a0,2,iVar1,1,iVar2,0x5a);
    iVar1 = iVar1 + *(int *)((long)&DAT_0011b280 + lVar3) * 0x78;
    __n = 1;
    smf::MidiFile::addNoteOff(&local_a0,2,iVar1,1,iVar2,0x5a);
    iVar2 = *(int *)((long)&DAT_0011b1b4 + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x3c);
  smf::MidiFile::sortTracks(&local_a0);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"twinkle.mid","");
  smf::MidiFile::write(&local_a0,(int)&local_c0,__buf,__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  smf::MidiFile::~MidiFile(&local_a0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile midifile;
   midifile.addTracks(2);    // Add another two tracks to the MIDI file
   int tpq = 120;            // ticks per quarter note
   midifile.setTicksPerQuarterNote(tpq);

   // melody to write to MIDI track 1: (60 = middle C)
                  // C5   C  G  G  A  A  G- F  F  E  E  D  D  C-
   int melody[50]  = {72,72,79,79,81,81,79,77,77,76,76,74,74,72,-1};
   int mrhythm[50] = { 1, 1, 1, 1, 1, 1, 2, 1, 1, 1, 1, 1, 1, 2,-1};

                  // C3 C4  E  C  F  C  E  C  D B3 C4 A3  F  G  C-
   int bass[50] =   {48,60,64,60,65,60,64,60,62,59,60,57,53,55,48,-1};
   int brhythm[50]= { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 2,-1};

   int actiontick = 0;
   int track      = 0;

   // Add some expression track (track 0) messages:
   midifile.addTrackName(track, actiontick, "Twinkle, Twinkle Little Star");
   midifile.addTempo(track, actiontick, 104.0);

   // Store melody line in track 1
   int i = 0;
   int velocity   = 64;
   int channel    = 0;
   track          = 1;

   midifile.addTrackName(track, actiontick, "Melody");
   midifile.addPatchChange(track, actiontick, channel, 40); // 40=violin

   while (melody[i] >= 0) {
      midifile.addNoteOn(track, actiontick, channel, melody[i], velocity);
      actiontick += tpq * mrhythm[i];
      midifile.addNoteOff(track, actiontick, channel, melody[i], velocity);
      i++;
   }

   // Store a base line in track 2 on channel 1 (indexed from 0):
   i = 0;
   actiontick   = 0;
   velocity     = 90;
   channel      = 1;
   track        = 2;

   midifile.addTrackName(track, actiontick, "Bass line");
   midifile.addPatchChange(track, actiontick, channel, 58); // 58=tuba

   while (bass[i] >= 0) {
      midifile.addNoteOn(track, actiontick, channel, bass[i], velocity);
      actiontick += tpq * brhythm[i];
      midifile.addNoteOff(track, actiontick, channel, bass[i], velocity);
      i++;
   }

   midifile.sortTracks();         // ensure tick times are in correct order
   midifile.write("twinkle.mid"); // write Standard MIDI File twinkle.mid
   return 0;
}